

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

optional<ChainType> GetNetworkForMagic(MessageStartChars *message)

{
  bool bVar1;
  MessageStartChars *pMVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  MessageStartChars signet_msg;
  MessageStartChars regtest_msg;
  MessageStartChars testnet4_msg;
  MessageStartChars testnet_msg;
  MessageStartChars mainnet_msg;
  CChainParams *in_stack_fffffffffffffe38;
  ChainType *in_stack_fffffffffffffe40;
  RegTestOptions *in_stack_fffffffffffffe48;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  _Optional_payload_base<ChainType> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::Main();
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe38);
  pMVar2 = CChainParams::MessageStart(in_stack_fffffffffffffe38);
  local_14 = *(undefined4 *)pMVar2->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe48);
  CChainParams::TestNet();
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe38);
  pMVar2 = CChainParams::MessageStart(in_stack_fffffffffffffe38);
  local_18 = *(undefined4 *)pMVar2->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe48);
  CChainParams::TestNet4();
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe38);
  pMVar2 = CChainParams::MessageStart(in_stack_fffffffffffffe38);
  local_1c = *(undefined4 *)pMVar2->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe48);
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_68 = 0;
  std::
  unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
  ::unordered_map((unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
                   *)in_stack_fffffffffffffe38);
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_30 = 0;
  std::
  unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
  ::unordered_map((unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
                   *)in_stack_fffffffffffffe38);
  local_28 = 0;
  CChainParams::RegTest(in_stack_fffffffffffffe48);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe38);
  pMVar2 = CChainParams::MessageStart(in_stack_fffffffffffffe38);
  local_20 = *(undefined4 *)pMVar2->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe48);
  CChainParams::RegTestOptions::~RegTestOptions((RegTestOptions *)in_stack_fffffffffffffe38);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_fffffffffffffe38);
  std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe38);
  CChainParams::SigNet((SigNetOptions *)in_stack_fffffffffffffe48);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe38);
  pMVar2 = CChainParams::MessageStart(in_stack_fffffffffffffe38);
  local_9c = *(undefined4 *)pMVar2->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffe48);
  CChainParams::SigNetOptions::~SigNetOptions((SigNetOptions *)in_stack_fffffffffffffe38);
  bVar1 = std::ranges::__equal_fn::
          operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,in_RDI,&local_14);
  if (bVar1) {
    std::optional<ChainType>::optional<ChainType,_true>
              ((optional<ChainType> *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  }
  else {
    bVar1 = std::ranges::__equal_fn::
            operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,in_RDI,&local_18);
    if (bVar1) {
      std::optional<ChainType>::optional<ChainType,_true>
                ((optional<ChainType> *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
    else {
      bVar1 = std::ranges::__equal_fn::
              operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,in_RDI,&local_1c);
      if (bVar1) {
        std::optional<ChainType>::optional<ChainType,_true>
                  ((optional<ChainType> *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      }
      else {
        bVar1 = std::ranges::__equal_fn::
                operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                          ((__equal_fn *)&std::ranges::equal,in_RDI,&local_20);
        if (bVar1) {
          std::optional<ChainType>::optional<ChainType,_true>
                    ((optional<ChainType> *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        }
        else {
          bVar1 = std::ranges::__equal_fn::
                  operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                            ((__equal_fn *)&std::ranges::equal,in_RDI,&local_9c);
          if (bVar1) {
            std::optional<ChainType>::optional<ChainType,_true>
                      ((optional<ChainType> *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          }
          else {
            std::optional<ChainType>::optional((optional<ChainType> *)&local_10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<ChainType>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ChainType> GetNetworkForMagic(const MessageStartChars& message)
{
    const auto mainnet_msg = CChainParams::Main()->MessageStart();
    const auto testnet_msg = CChainParams::TestNet()->MessageStart();
    const auto testnet4_msg = CChainParams::TestNet4()->MessageStart();
    const auto regtest_msg = CChainParams::RegTest({})->MessageStart();
    const auto signet_msg = CChainParams::SigNet({})->MessageStart();

    if (std::ranges::equal(message, mainnet_msg)) {
        return ChainType::MAIN;
    } else if (std::ranges::equal(message, testnet_msg)) {
        return ChainType::TESTNET;
    } else if (std::ranges::equal(message, testnet4_msg)) {
        return ChainType::TESTNET4;
    } else if (std::ranges::equal(message, regtest_msg)) {
        return ChainType::REGTEST;
    } else if (std::ranges::equal(message, signet_msg)) {
        return ChainType::SIGNET;
    }
    return std::nullopt;
}